

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O3

void setup_hal_bufs(HalH264eVepu511Ctx *ctx)

{
  MppEncCfgSet *pMVar1;
  MppEncCpbInfo *pMVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  MppBuffer *buffer;
  size_t sizes [3];
  
  pMVar1 = ctx->cfg;
  uVar11 = (pMVar1->prep).width + 0x3f;
  uVar10 = ((pMVar1->prep).height + 0xfU & 0xfffffff0) + 0x10;
  uVar4 = uVar10 * ((int)uVar11 >> 6);
  uVar6 = uVar4 + 0x3f;
  if (-1 < (int)uVar4) {
    uVar6 = uVar4;
  }
  uVar4 = ctx->max_buf_cnt;
  if (pMVar1->ref_cfg == (MppEncRefCfg)0x0) {
    uVar3 = 4;
  }
  else {
    pMVar2 = mpp_enc_ref_cfg_get_cpb_info(pMVar1->ref_cfg);
    uVar3 = 4;
    if (3 < pMVar2->dpb_size) {
      uVar3 = (ulong)(pMVar2->dpb_size + 1);
    }
  }
  if ((int)(uVar11 & 0xffffffc0) < 0x1001) {
    clear_ext_line_bufs(ctx);
    if (ctx->ext_line_buf_grp != (MppBufferGroup)0x0) {
      mpp_buffer_group_clear(ctx->ext_line_buf_grp);
      mpp_buffer_group_put(ctx->ext_line_buf_grp);
      ctx->ext_line_buf_grp = (MppBufferGroup)0x0;
    }
    ctx->ext_line_buf_size = 0;
  }
  else {
    uVar8 = (uVar11 >> 6) * 0x350 - 0xaea0 & 0xffffff00;
    if (ctx->ext_line_buf_grp == (MppBufferGroup)0x0) {
      mpp_buffer_group_get
                (&ctx->ext_line_buf_grp,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h264e_vepu511",
                 "setup_hal_bufs");
    }
    else if (uVar8 != ctx->ext_line_buf_size) {
      clear_ext_line_bufs(ctx);
      mpp_buffer_group_clear(ctx->ext_line_buf_grp);
    }
    if ((ctx->ext_line_buf_grp == (MppBufferGroup)0x0) &&
       (_mpp_log_l(2,"hal_h264e_vepu511","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->ext_line_buf_grp","setup_hal_bufs",0x1ae), (mpp_debug._3_1_ & 0x10) != 0))
    {
      abort();
    }
    ctx->ext_line_buf_size = uVar8;
    uVar8 = ctx->task_cnt;
    if (uVar8 != 0) {
      buffer = ctx->ext_line_bufs;
      uVar9 = 0;
      do {
        if (*buffer == (MppBuffer)0x0) {
          mpp_buffer_get_with_tag
                    (ctx->ext_line_buf_grp,buffer,(long)ctx->ext_line_buf_size,"hal_h264e_vepu511",
                     "setup_ext_line_bufs");
          uVar8 = ctx->task_cnt;
        }
        uVar9 = uVar9 + 1;
        buffer = buffer + 1;
      } while (uVar9 < uVar8);
    }
  }
  iVar5 = (uVar11 & 0xffffffc0) * uVar10;
  uVar12 = (iVar5 >> 6) + 0x1fffU & 0xffffe000;
  iVar5 = (iVar5 >> 1) + iVar5;
  uVar8 = uVar12 + iVar5;
  uVar7 = (uVar6 & 0xffffffc0) * 4 + 0x1fff & 0xffffe000;
  uVar6 = (uint)uVar3;
  if ((((ctx->pixel_buf_fbc_hdr_size != uVar12) || (ctx->pixel_buf_fbc_bdy_size != iVar5)) ||
      (ctx->pixel_buf_size != uVar8)) ||
     ((ctx->thumb_buf_size != uVar7 || ((int)uVar4 < (int)uVar6)))) {
    if (((byte)hal_h264e_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu511","frame size %d -> %d max count %d -> %d\n","setup_hal_bufs",
                 (ulong)(uint)ctx->pixel_buf_size,(ulong)uVar8,(ulong)uVar4,uVar3);
    }
    sizes[0] = (size_t)(int)uVar8;
    sizes[1] = (size_t)(int)uVar7;
    sizes[2] = (size_t)(int)(((uVar10 >> 4) + 0xf & 0xffffff0) *
                            (((int)uVar11 >> 6) + 0xfU & 0xfffffff0));
    if ((int)uVar4 < (int)uVar6) {
      uVar4 = uVar6;
    }
    hal_bufs_setup(ctx->hw_recn,uVar4,3,sizes);
    ctx->pixel_buf_fbc_hdr_size = uVar12;
    ctx->pixel_buf_fbc_bdy_size = iVar5;
    ctx->pixel_buf_size = uVar8;
    ctx->thumb_buf_size = uVar7;
    ctx->max_buf_cnt = uVar4;
  }
  return;
}

Assistant:

static void setup_hal_bufs(HalH264eVepu540cCtx *ctx)
{
    MppEncCfgSet *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    RK_S32 alignment = 64;
    RK_S32 aligned_w = MPP_ALIGN(prep->width,  alignment);
    RK_S32 aligned_h = MPP_ALIGN(prep->height, alignment);
    RK_S32 pixel_buf_fbc_hdr_size = MPP_ALIGN(aligned_w * aligned_h / 64, SZ_8K);
    RK_S32 pixel_buf_fbc_bdy_size = aligned_w * aligned_h * 3 / 2;
    RK_S32 pixel_buf_size = pixel_buf_fbc_hdr_size + pixel_buf_fbc_bdy_size;
    RK_S32 thumb_buf_size = MPP_ALIGN(aligned_w / 64 * aligned_h / 64 * 256, SZ_8K);
    RK_S32 old_max_cnt = ctx->max_buf_cnt;
    RK_S32 new_max_cnt = 2;
    MppEncRefCfg ref_cfg = cfg->ref_cfg;

    if (ref_cfg) {
        MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
        if (new_max_cnt < MPP_MAX(new_max_cnt, info->dpb_size + 1))
            new_max_cnt = MPP_MAX(new_max_cnt, info->dpb_size + 1);
    }

    if (aligned_w > (3 * SZ_1K)) {
        RK_S32 ext_line_buf_size = (aligned_w / 64 - 36) * 56 * 16;

        if (NULL == ctx->ext_line_buf_grp)
            mpp_buffer_group_get_internal(&ctx->ext_line_buf_grp, MPP_BUFFER_TYPE_ION);
        else if (ext_line_buf_size != ctx->ext_line_buf_size) {
            mpp_buffer_put(ctx->ext_line_buf);
            ctx->ext_line_buf = NULL;
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        }

        mpp_assert(ctx->ext_line_buf_grp);

        if (NULL == ctx->ext_line_buf)
            mpp_buffer_get(ctx->ext_line_buf_grp, &ctx->ext_line_buf, ext_line_buf_size);

        ctx->ext_line_buf_size = ext_line_buf_size;
    } else {
        if (ctx->ext_line_buf) {
            mpp_buffer_put(ctx->ext_line_buf);
            ctx->ext_line_buf = NULL;
        }

        if (ctx->ext_line_buf_grp) {
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
            mpp_buffer_group_put(ctx->ext_line_buf_grp);
            ctx->ext_line_buf_grp = NULL;
        }
        ctx->ext_line_buf_size = 0;
    }

    if ((ctx->pixel_buf_fbc_hdr_size != pixel_buf_fbc_hdr_size) ||
        (ctx->pixel_buf_fbc_bdy_size != pixel_buf_fbc_bdy_size) ||
        (ctx->pixel_buf_size != pixel_buf_size) ||
        (ctx->thumb_buf_size != thumb_buf_size) ||
        (new_max_cnt > old_max_cnt)) {
        size_t sizes[2];

        hal_h264e_dbg_detail("frame size %d -> %d max count %d -> %d\n",
                             ctx->pixel_buf_size, pixel_buf_size,
                             old_max_cnt, new_max_cnt);

        /* pixel buffer */
        sizes[0] = pixel_buf_size;
        /* thumb buffer */
        sizes[1] = thumb_buf_size;
        new_max_cnt = MPP_MAX(new_max_cnt, old_max_cnt);

        hal_bufs_setup(ctx->hw_recn, new_max_cnt, 2, sizes);

        ctx->pixel_buf_fbc_hdr_size = pixel_buf_fbc_hdr_size;
        ctx->pixel_buf_fbc_bdy_size = pixel_buf_fbc_bdy_size;
        ctx->pixel_buf_size = pixel_buf_size;
        ctx->thumb_buf_size = thumb_buf_size;
        ctx->max_buf_cnt = new_max_cnt;
    }
}